

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<96U,_unsigned_short,_void,_false>::eval_divide_knuth
          (uintwide_t<96U,_unsigned_short,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  uintwide_t<96U,_unsigned_short,_void,_false> *puVar1;
  ushort uVar2;
  long lVar3;
  unsigned_fast_type v_offset;
  byte bVar4;
  unsigned_fast_type u_offset;
  
  lVar3 = 0xc;
  u_offset = 0;
  do {
    if (*(short *)(this + lVar3 + -2) != 0) goto LAB_0014d11e;
    u_offset = u_offset + 1;
    lVar3 = lVar3 + -2;
  } while (lVar3 != 0);
  u_offset = 6;
LAB_0014d11e:
  lVar3 = 0xc;
  v_offset = 0;
  do {
    if (*(short *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar3 + -2) != 0)
    goto LAB_0014d13b;
    v_offset = v_offset + 1;
    lVar3 = lVar3 + -2;
  } while (lVar3 != 0);
  v_offset = 6;
LAB_0014d13b:
  if (v_offset == 6) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined4 *)(this + 8) = 0xffffffff;
  }
  else if (u_offset != 6) {
    lVar3 = 10;
    do {
      bVar4 = 0;
      if (lVar3 == -2) break;
      puVar1 = this + lVar3;
      uVar2 = *(ushort *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar3);
      bVar4 = -(*(ushort *)puVar1 <= uVar2) | 1;
      lVar3 = lVar3 + -2;
    } while (*(ushort *)puVar1 == uVar2);
    if (bVar4 != 0) {
      if (bVar4 == 0xff) {
        if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
          *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) =
               *(undefined4 *)(this + 8);
          *(undefined8 *)remainder = *(undefined8 *)this;
        }
        *(undefined4 *)(this + 8) = 0;
        *(undefined8 *)this = 0;
        return;
      }
      void_math::wide_integer::uintwide_t<96u,unsigned_short,void,false>::
      eval_divide_knuth_core<96u>(unsigned_long,unsigned_long,math::wide_integer::
      uintwide_t<96u,unsigned_short,void,false>const&,math::wide_integer::
      uintwide_t<96u,unsigned_short,void,false>*,std::
      enable_if<((96u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
      digits))),int>::type__
                (this,u_offset,v_offset,other,remainder,
                 (enable_if_t<(96U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                  *)0x0);
      return;
    }
    *(undefined2 *)this = 1;
    *(undefined8 *)(this + 2) = 0;
    *(undefined2 *)(this + 10) = 0;
  }
  if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
    *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) = 0;
    *(undefined8 *)remainder = 0;
  }
  return;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }